

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSP.hpp
# Opt level: O2

void __thiscall Tour::printTour(Tour *this)

{
  int *__k;
  int iVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  int iVar4;
  int iVar5;
  int prev_node;
  int next_node;
  int local_38;
  int local_34;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Forward Traversal");
  std::endl<char,std::char_traits<char>>(poVar2);
  __k = &this->head_node_;
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,__k);
  iVar5 = pmVar3->next_idx_;
  local_34 = iVar5;
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,__k);
  iVar4 = pmVar3->prev_idx_;
  local_38 = iVar4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->head_node_);
  std::operator<<(poVar2,"-->");
  while( true ) {
    iVar1 = *__k;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    if (iVar5 == iVar1) break;
    std::operator<<(poVar2,"-->");
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_34);
    iVar5 = pmVar3->next_idx_;
    local_34 = iVar5;
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Back Traversal");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*__k);
  std::operator<<(poVar2,"<--");
  while( true ) {
    iVar5 = *__k;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    if (iVar4 == iVar5) break;
    std::operator<<(poVar2,"<--");
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_38);
    iVar4 = pmVar3->prev_idx_;
    local_38 = iVar4;
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void printTour()
    {
        PRINTN("Forward Traversal")
        int next_node = tour_map_[head_node_].next_idx_;
        int prev_node = tour_map_[head_node_].prev_idx_;
        PRINT(head_node_ << "-->")
        while(next_node != head_node_)
        {
            PRINT(next_node << "-->")
            next_node = tour_map_[next_node].next_idx_;
        }
        PRINTN(head_node_)
        
        PRINTN("Back Traversal")
        PRINT(head_node_ << "<--")
        while(prev_node != head_node_)
        {
            PRINT(prev_node << "<--")
            prev_node = tour_map_[prev_node].prev_idx_;
        }
         PRINTN(head_node_)

    }